

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RepeatLoopFixedInst::Exec
          (RepeatLoopFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Label LVar4;
  LoopInfo *pLVar5;
  PageAllocation *pPVar6;
  code *pcVar7;
  bool bVar8;
  uint uVar9;
  undefined4 *puVar10;
  char *pcVar11;
  size_t sVar12;
  Program *pPVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  
  uVar14 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  pPVar13 = (matcher->program).ptr;
  if ((ulong)(pPVar13->rep).insts.instsLen < uVar14 + 0x17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar8) goto LAB_00ef95ba;
    *puVar10 = 0;
    pPVar13 = (matcher->program).ptr;
  }
  lVar17 = *(long *)&pPVar13->rep;
  if (*(char *)(lVar17 + uVar14) != 'J') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar8) goto LAB_00ef95ba;
    *puVar10 = 0;
    pPVar13 = (matcher->program).ptr;
    lVar17 = *(long *)&pPVar13->rep;
  }
  iVar2 = *(int *)(lVar17 + 1 + uVar14);
  lVar15 = (long)iVar2;
  if ((lVar15 < 0) || (pPVar13->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar8) goto LAB_00ef95ba;
    *puVar10 = 0;
  }
  pLVar5 = (matcher->loopInfos).ptr;
  uVar9 = pLVar5[lVar15].number + 1;
  pLVar5[lVar15].number = uVar9;
  uVar16 = *(uint *)(lVar17 + 5 + uVar14);
  if (uVar9 < uVar16) {
    uVar16 = (this->super_RepeatLoopMixin).beginLabel + 0x17;
  }
  else {
    uVar3 = *(uint *)(lVar17 + 9 + uVar14);
    if ((uVar3 == 0xffffffff) || (uVar9 < uVar3)) {
      if (uVar9 == uVar16) {
        sVar12 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.bufferSize;
        if (sVar12 - (contStack->
                     super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                     super_ContinuousPageStack<1UL>.nextTop < 0x20) {
          ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
          sVar12 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>)
                   .super_ContinuousPageStack<1UL>.bufferSize;
        }
        if (sVar12 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                             ,199,"(bufferSize)","bufferSize");
          if (!bVar8) goto LAB_00ef95ba;
          *puVar10 = 0;
        }
        pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.pageAllocation;
        sVar12 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop = sVar12 + 0x20;
        *(size_t *)((long)&pPVar6[1].pageCount + sVar12) =
             (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             topElementSize;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        topElementSize = 0x20;
        LVar4 = (this->super_RepeatLoopMixin).beginLabel;
        *(undefined1 *)((long)&pPVar6[2].pageCount + sVar12) = 7;
        *(undefined ***)((long)&pPVar6[1].segment + sVar12) = &PTR_Print_015433c8;
        *(Label *)((long)&pPVar6[2].pageCount + sVar12 + 4) = LVar4;
        *(undefined1 *)((long)&pPVar6[2].segment + sVar12) = 1;
        Matcher::PushStats(matcher,contStack,input);
      }
      uVar16 = (this->super_RepeatLoopMixin).beginLabel + 0x17;
    }
    else {
      if (uVar16 < uVar3) {
        pcVar11 = ContinuousPageStack<1UL>::Top
                            ((ContinuousPageStack<1UL> *)contStack,
                             (contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                             topElementSize);
        pcVar1 = pcVar11 + 8;
        if (pcVar11 == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xd20,"(top != 0)","top != 0");
          if (!bVar8) goto LAB_00ef95ba;
          *puVar10 = 0;
          pcVar1 = (char *)0x0;
        }
        if (pcVar1[8] != '\a') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xd21,"(top->tag == Cont::ContTag::RewindLoopFixed)",
                             "top->tag == Cont::ContTag::RewindLoopFixed");
          if (!bVar8) goto LAB_00ef95ba;
          *puVar10 = 0;
        }
        pcVar1[0x10] = '\0';
      }
      uVar16 = *(uint *)(lVar17 + 0xf + uVar14);
    }
  }
  pPVar13 = (matcher->program).ptr;
  if ((pPVar13->rep).insts.instsLen <= uVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar8) {
LAB_00ef95ba:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar10 = 0;
    pPVar13 = (matcher->program).ptr;
  }
  *instPointer = (pPVar13->rep).insts.insts.ptr + uVar16;
  return false;
}

Assistant:

inline bool RepeatLoopFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixed);
                RewindLoopFixedCont* rewind = (RewindLoopFixedCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        return false;
    }